

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5StructurePromote(Fts5Index *p,int iLvl,Fts5Structure *pStruct)

{
  uint *puVar1;
  int *piVar2;
  u64 *puVar3;
  undefined8 *puVar4;
  Fts5StructureSegment *pFVar5;
  Fts5StructureSegment *pFVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  u64 uVar9;
  u64 uVar10;
  u64 uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  Fts5StructureSegment **ppFVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong in_R8;
  int iVar19;
  long local_50;
  
  if (p->rc != 0) {
    return;
  }
  lVar14 = (long)pStruct->aLevel[iLvl].nSeg;
  if (lVar14 != 0) {
    pFVar5 = pStruct->aLevel[iLvl].aSeg;
    iVar12 = (pFVar5[lVar14 + -1].pgnoLast - pFVar5[lVar14 + -1].pgnoFirst) + 1;
    ppFVar15 = &pStruct->aLevel[(uint)iLvl].aSeg;
    iVar13 = iLvl;
    do {
      if (iVar13 < 1) {
        iVar13 = -1;
        iVar18 = 0;
        goto LAB_001e71a7;
      }
      puVar1 = (uint *)((long)ppFVar15 + -0x14);
      in_R8 = (ulong)*puVar1;
      iVar13 = iVar13 + -1;
      ppFVar15 = ppFVar15 + -2;
    } while (in_R8 == 0);
    iVar18 = 0;
    if (0 < (int)*puVar1) {
      lVar14 = in_R8 * 0x38;
      in_R8 = 0;
      iVar18 = 0;
      do {
        iVar19 = *(int *)((long)&(*ppFVar15)->pgnoLast + in_R8) -
                 *(int *)((long)&(*ppFVar15)->pgnoFirst + in_R8);
        if (iVar18 <= iVar19) {
          iVar18 = iVar19 + 1;
        }
        in_R8 = in_R8 + 0x38;
      } while (lVar14 - in_R8 != 0);
    }
    if (iVar18 < iVar12) {
      iVar13 = -1;
      iVar18 = 0;
    }
LAB_001e71a7:
    if (-1 < iVar13) {
      iLvl = iVar13;
      iVar12 = iVar18;
    }
    if (pStruct->aLevel[iLvl].nMerge == 0) {
      iVar13 = pStruct->nLevel;
      if (iLvl + 1 < iVar13) {
        local_50 = (long)(iLvl + 1);
        while (pStruct->aLevel[local_50].nMerge == 0) {
          lVar14 = (long)pStruct->aLevel[local_50].nSeg;
          if (0 < lVar14) {
            lVar16 = lVar14 * 0x38;
            uVar17 = lVar14 + 1;
            do {
              pFVar5 = pStruct->aLevel[local_50].aSeg;
              if (iVar12 < (*(int *)((long)pFVar5 + lVar16 + -0x30) -
                           *(int *)((long)pFVar5 + lVar16 + -0x34)) + 1) {
                return;
              }
              fts5StructureExtendLevel(&p->rc,pStruct,iLvl,1,(int)in_R8);
              if (p->rc != 0) {
                return;
              }
              pFVar5 = pStruct->aLevel[iLvl].aSeg;
              pFVar6 = pStruct->aLevel[local_50].aSeg;
              pFVar5->nEntry = *(u64 *)(lVar16 + -8 + (long)pFVar6);
              puVar4 = (undefined8 *)((long)&pFVar6[-1].iSegid + lVar16);
              uVar7 = *puVar4;
              uVar8 = puVar4[1];
              puVar3 = (u64 *)(lVar16 + -0x28 + (long)pFVar6);
              uVar9 = *puVar3;
              uVar10 = puVar3[1];
              puVar4 = (undefined8 *)(lVar16 + -0x18 + (long)pFVar6);
              uVar11 = puVar4[1];
              *(undefined8 *)&pFVar5->nPgTombstone = *puVar4;
              pFVar5->nEntryTombstone = uVar11;
              pFVar5->iOrigin1 = uVar9;
              pFVar5->iOrigin2 = uVar10;
              pFVar5->iSegid = (int)uVar7;
              pFVar5->pgnoFirst = (int)((ulong)uVar7 >> 0x20);
              *(undefined8 *)&pFVar5->pgnoLast = uVar8;
              piVar2 = &pStruct->aLevel[iLvl].nSeg;
              *piVar2 = *piVar2 + 1;
              piVar2 = &pStruct->aLevel[local_50].nSeg;
              *piVar2 = *piVar2 + -1;
              uVar17 = uVar17 - 1;
              lVar16 = lVar16 + -0x38;
            } while (1 < uVar17);
            iVar13 = pStruct->nLevel;
          }
          local_50 = local_50 + 1;
          if (iVar13 <= local_50) {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void fts5StructurePromote(
  Fts5Index *p,                   /* FTS5 backend object */
  int iLvl,                       /* Index level just updated */
  Fts5Structure *pStruct          /* Index structure */
){
  if( p->rc==SQLITE_OK ){
    int iTst;
    int iPromote = -1;
    int szPromote = 0;            /* Promote anything this size or smaller */
    Fts5StructureSegment *pSeg;   /* Segment just written */
    int szSeg;                    /* Size of segment just written */
    int nSeg = pStruct->aLevel[iLvl].nSeg;

    if( nSeg==0 ) return;
    pSeg = &pStruct->aLevel[iLvl].aSeg[pStruct->aLevel[iLvl].nSeg-1];
    szSeg = (1 + pSeg->pgnoLast - pSeg->pgnoFirst);

    /* Check for condition (a) */
    for(iTst=iLvl-1; iTst>=0 && pStruct->aLevel[iTst].nSeg==0; iTst--);
    if( iTst>=0 ){
      int i;
      int szMax = 0;
      Fts5StructureLevel *pTst = &pStruct->aLevel[iTst];
      assert( pTst->nMerge==0 );
      for(i=0; i<pTst->nSeg; i++){
        int sz = pTst->aSeg[i].pgnoLast - pTst->aSeg[i].pgnoFirst + 1;
        if( sz>szMax ) szMax = sz;
      }
      if( szMax>=szSeg ){
        /* Condition (a) is true. Promote the newest segment on level
        ** iLvl to level iTst.  */
        iPromote = iTst;
        szPromote = szMax;
      }
    }

    /* If condition (a) is not met, assume (b) is true. StructurePromoteTo()
    ** is a no-op if it is not.  */
    if( iPromote<0 ){
      iPromote = iLvl;
      szPromote = szSeg;
    }
    fts5StructurePromoteTo(p, iPromote, szPromote, pStruct);
  }
}